

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O1

Value * __thiscall
GlobOptBlockData::MergeValues
          (GlobOptBlockData *this,Value *toDataValue,Value *fromDataValue,Sym *fromDataSym,
          bool isLoopBackEdge,bool forceUniqueValue,
          BVSparse<Memory::JitArenaAllocator> *symsRequiringCompensation,
          BVSparse<Memory::JitArenaAllocator> *symsCreatedForMerge)

{
  uint uVar1;
  ValueNumberPairToValueMap *pVVar2;
  Type piVar3;
  Type pSVar4;
  Type this_00;
  GlobOpt *this_01;
  Sym *sym;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  ValueInfo *valueInfo;
  undefined4 *puVar10;
  uint uVar11;
  undefined1 local_54 [8];
  ValueNumberPair sourceValueNumberPair;
  Value *newValue;
  
  if (toDataValue != fromDataValue) {
    local_54._0_4_ = toDataValue->valueNumber;
    local_54._4_4_ = fromDataValue->valueNumber;
    sourceValueNumberPair.first._0_1_ = 1;
    puVar9 = JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::First
                       ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_54);
    uVar8 = *puVar9;
    puVar9 = JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::Second
                       ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_54);
    uVar1 = *puVar9;
    valueInfo = MergeValueInfo(this,toDataValue,fromDataValue,fromDataSym,isLoopBackEdge,
                               uVar8 == uVar1,symsRequiringCompensation,symsCreatedForMerge);
    if (valueInfo == (ValueInfo *)0x0) {
      toDataValue = (Value *)0x0;
    }
    else if ((uVar8 != uVar1) || (valueInfo != toDataValue->valueInfo)) {
      sourceValueNumberPair.second = 0;
      sourceValueNumberPair.initialized = false;
      sourceValueNumberPair._9_3_ = 0;
      if (forceUniqueValue) {
        sourceValueNumberPair._4_8_ = GlobOpt::NewValue(this->globOpt,valueInfo);
      }
      else {
        pVVar2 = this->globOpt->valuesCreatedForMerge;
        piVar3 = pVVar2->buckets;
        uVar7 = 0;
        if (piVar3 != (Type)0x0) {
          uVar7 = JsUtil::
                  BaseDictionary<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::GetBucket((local_54._4_4_ + local_54._0_4_) * 2 + 1,pVVar2->bucketCount,
                              pVVar2->modFunctionIndex);
          uVar11 = piVar3[uVar7];
          uVar7 = 0;
          if (-1 < (int)uVar11) {
            pSVar4 = pVVar2->entries;
            uVar7 = 0;
            do {
              if ((pSVar4[uVar11].
                   super_DefaultHashedEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .
                   super_KeyValueEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
                   .
                   super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>_>
                   .
                   super_KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
                   .key.first == local_54._0_4_) &&
                 (pSVar4[uVar11].
                  super_DefaultHashedEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                  .
                  super_KeyValueEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
                  .
                  super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>_>
                  .
                  super_KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
                  .key.second == local_54._4_4_)) {
                this_00 = pVVar2->stats;
                goto joined_r0x0049950a;
              }
              uVar7 = uVar7 + 1;
              uVar11 = pSVar4[uVar11].
                       super_DefaultHashedEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                       .
                       super_KeyValueEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
                       .
                       super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>_>
                       .
                       super_KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
                       .next;
            } while (-1 < (int)uVar11);
          }
        }
        this_00 = pVVar2->stats;
        uVar11 = 0xffffffff;
joined_r0x0049950a:
        if (this_00 != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(this_00,uVar7);
        }
        if ((int)uVar11 < 0) {
          sourceValueNumberPair._4_8_ = (Value *)0x0;
        }
        else {
          sourceValueNumberPair._4_8_ =
               pVVar2->entries[uVar11].
               super_DefaultHashedEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
               .
               super_KeyValueEntry<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
               .
               super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>_>
               .
               super_KeyValueEntryDataLayout2<JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>,_Value_*>
               .value;
        }
        if ((Value *)sourceValueNumberPair._4_8_ == (Value *)0x0) {
          this_01 = this->globOpt;
          if (uVar8 == uVar1) {
            puVar9 = JsUtil::Pair<unsigned_int,_unsigned_int,_DefaultComparer>::First
                               ((Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_54);
            uVar8 = *puVar9;
          }
          else {
            uVar8 = GlobOpt::NewValueNumber(this_01);
          }
          sourceValueNumberPair._4_8_ = GlobOpt::NewValue(this_01,uVar8,valueInfo);
          JsUtil::
          BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
          ::
          Insert<(JsUtil::BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                    ((BaseDictionary<JsUtil::Pair<unsigned_int,unsigned_int,DefaultComparer>,Value*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                      *)this->globOpt->valuesCreatedForMerge,
                     (Pair<unsigned_int,_unsigned_int,_DefaultComparer> *)local_54,
                     (Value **)&sourceValueNumberPair.second);
        }
        else {
          if ((((Value *)sourceValueNumberPair._4_8_)->valueNumber != toDataValue->valueNumber) ==
              (uVar8 == uVar1)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar10 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar10 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                               ,0x38b,
                               "(sameValueNumber == (newValue->GetValueNumber() == toDataValue->GetValueNumber()))"
                               ,
                               "sameValueNumber == (newValue->GetValueNumber() == toDataValue->GetValueNumber())"
                              );
            if (!bVar6) {
              pcVar5 = (code *)invalidInstructionException();
              (*pcVar5)();
            }
            *puVar10 = 0;
          }
          *(ValueInfo **)(sourceValueNumberPair._4_8_ + 8) = valueInfo;
        }
      }
      sym = toDataValue->valueInfo->symStore;
      toDataValue = (Value *)sourceValueNumberPair._4_8_;
      if (sym == fromDataValue->valueInfo->symStore) {
        GlobOpt::SetSymStoreDirect(this->globOpt,valueInfo,sym);
        toDataValue = (Value *)sourceValueNumberPair._4_8_;
      }
    }
  }
  return toDataValue;
}

Assistant:

Value *
GlobOptBlockData::MergeValues(
    Value *toDataValue,
    Value *fromDataValue,
    Sym *fromDataSym,
    bool isLoopBackEdge,
    bool forceUniqueValue,
    BVSparse<JitArenaAllocator> *const symsRequiringCompensation,
    BVSparse<JitArenaAllocator> *const symsCreatedForMerge)
{
    // Same map
    if (toDataValue == fromDataValue)
    {
        return toDataValue;
    }

    const ValueNumberPair sourceValueNumberPair(toDataValue->GetValueNumber(), fromDataValue->GetValueNumber());
    const bool sameValueNumber = sourceValueNumberPair.First() == sourceValueNumberPair.Second();

    ValueInfo *newValueInfo =
        this->MergeValueInfo(
            toDataValue,
            fromDataValue,
            fromDataSym,
            isLoopBackEdge,
            sameValueNumber,
            symsRequiringCompensation,
            symsCreatedForMerge);

    if (newValueInfo == nullptr)
    {
        return nullptr;
    }

    if (sameValueNumber && newValueInfo == toDataValue->GetValueInfo())
    {
        return toDataValue;
    }

    Value *newValue = nullptr;
    if (forceUniqueValue)
    {
        newValue = this->globOpt->NewValue(newValueInfo);
    }
    else
    {
        // There may be other syms in toData that haven't been merged yet, referring to the current toData value for this sym. If
        // the merge produced a new value info, don't corrupt the value info for the other sym by changing the same value. Instead,
        // create one value per source value number pair per merge and reuse that for new value infos.
        newValue = this->globOpt->valuesCreatedForMerge->Lookup(sourceValueNumberPair, nullptr);
        if (newValue)
        {
            Assert(sameValueNumber == (newValue->GetValueNumber() == toDataValue->GetValueNumber()));

            // This is an exception where Value::SetValueInfo is called directly instead of GlobOpt::ChangeValueInfo, because we're
            // actually generating new value info through merges.
            newValue->SetValueInfo(newValueInfo);
        }
        else
        {
            newValue = this->globOpt->NewValue(sameValueNumber ? sourceValueNumberPair.First() : this->globOpt->NewValueNumber(), newValueInfo);
            this->globOpt->valuesCreatedForMerge->Add(sourceValueNumberPair, newValue);
        }
    }

    // Set symStore if same on both paths.
    if (toDataValue->GetValueInfo()->GetSymStore() == fromDataValue->GetValueInfo()->GetSymStore())
    {
        this->globOpt->SetSymStoreDirect(newValueInfo, toDataValue->GetValueInfo()->GetSymStore());
    }

    return newValue;
}